

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_args.c
# Opt level: O0

int mpt_config_args(mpt_config *cfg,mpt_iterator *args,mpt_logger *info)

{
  undefined8 *puVar1;
  int iVar2;
  char *pcVar3;
  undefined8 in_stack_ffffffffffffff38;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  mpt_convertable *conv;
  char *end;
  void *ptr;
  mpt_value *val;
  mpt_property pr;
  uint local_50;
  int err;
  int count;
  int res;
  mpt_path p;
  mpt_logger *info_local;
  mpt_iterator *args_local;
  mpt_config *cfg_local;
  
  _count = (char *)0x0;
  p.base = (char *)0x0;
  p.off = 0;
  p.len = 0x2e0000;
  p._24_8_ = info;
  if (args == (mpt_iterator *)0x0) {
    cfg_local._4_4_ = (*cfg->_vptr->assign)(cfg,(mpt_path *)&count,(mpt_value *)0x0);
    if ((int)cfg_local._4_4_ < 0) {
      if (p._24_8_ != 0) {
        mpt_log((mpt_logger *)p._24_8_,"mpt_config_args",3,"%s","unable to set default config");
      }
    }
    else {
      cfg_local._4_4_ = 0;
    }
  }
  else {
    pr._buf[0xc] = '\0';
    pr._buf[0xd] = '\0';
    pr._buf[0xe] = '\0';
    pr._buf[0xf] = '\0';
    local_50 = 0;
    do {
      memset(&val,0,0x30);
      ptr = (*args->_vptr->value)(args);
      if (((mpt_value *)ptr == (mpt_value *)0x0) ||
         (end = (char *)((mpt_value *)ptr)->_addr, (long *)end == (long *)0x0)) {
        if (p._24_8_ != 0) {
          mpt_log((mpt_logger *)p._24_8_,"mpt_config_args",3,"%s","unable to set default config");
        }
      }
      else if (((((mpt_value *)ptr)->_type == 0x80) || (((mpt_value *)ptr)->_type == 0x801)) ||
              ((0xff < ((mpt_value *)ptr)->_type && (((mpt_value *)ptr)->_type < 0x800)))) {
        puVar1 = *(undefined8 **)end;
        if (puVar1 == (undefined8 *)0x0) {
          if (p._24_8_ != 0) {
            mpt_log((mpt_logger *)p._24_8_,"mpt_config_args",3,"%s","missing convertable pointer");
          }
        }
        else {
          iVar2 = (**(code **)*puVar1)(puVar1,0x1a,&val);
          if ((iVar2 < 0) || (pr.val._addr == (void *)0x0)) {
            iVar2 = (**(code **)*puVar1)(puVar1,0x73,&val);
            if (iVar2 < 0) {
              if (p._24_8_ != 0) {
                mpt_log((mpt_logger *)p._24_8_,"mpt_config_args",3,"%s","invalid assinment");
              }
            }
            else {
              if (val != (mpt_value *)0x0) goto LAB_0010db4e;
              if (p._24_8_ != 0) {
                mpt_log((mpt_logger *)p._24_8_,"mpt_config_args",3,"%s","invalid property name");
              }
            }
          }
          else {
            p.len._0_4_ = CONCAT13(0,(uint3)p.len);
            mpt_path_set((mpt_path *)&count,(char *)val,-1);
LAB_0010db4e:
            if (pr.val._addr == (void *)0x0) {
              pcVar3 = strchr((char *)val,0x3d);
              if (pcVar3 == (char *)0x0) {
                pr._buf._12_4_ = pr._buf._12_4_ + 1;
                if (p._24_8_ != 0) {
                  mpt_log((mpt_logger *)p._24_8_,"mpt_config_args",4,"%s: %s",
                          "missing path separator",val);
                }
                goto LAB_0010dd3e;
              }
              p.len._0_4_ = CONCAT13(0x3d,(uint3)p.len);
              mpt_path_set((mpt_path *)&count,(char *)val,(int)pcVar3 - (int)val);
              pr.val._addr = (void *)0x73;
              pr.val._type = (mpt_type_t)(pcVar3 + 1);
              pr.desc = (char *)&pr.val._type;
            }
            if (val == (mpt_value *)0x0) {
              pr._buf._12_4_ = pr._buf._12_4_ + 1;
              if (p._24_8_ != 0) {
                local_50 = local_50 + 1;
                mpt_log((mpt_logger *)p._24_8_,"mpt_config_args",4,"%s: %d","missing config path");
              }
              if (local_50 == 0) {
                local_ac = 0xfffffffd;
              }
              else {
                local_ac = local_50;
              }
              return local_ac;
            }
            iVar2 = (*cfg->_vptr->assign)(cfg,(mpt_path *)&count,(mpt_value *)&pr.desc);
            if (iVar2 < 0) {
              pr._buf._12_4_ = pr._buf._12_4_ + 1;
              if (p._24_8_ == 0) {
                if (local_50 == 0) {
                  local_b0 = 0xfffffffe;
                }
                else {
                  local_b0 = local_50;
                }
                return local_b0;
              }
              local_50 = local_50 + 1;
              in_stack_ffffffffffffff38 =
                   CONCAT44((int)((ulong)in_stack_ffffffffffffff38 >> 0x20),local_50);
              mpt_log((mpt_logger *)p._24_8_,"mpt_config_args",3,"%s (%d): %d","config assign error"
                      ,*(undefined8 *)((long)ptr + 8),in_stack_ffffffffffffff38);
            }
            else if (p._24_8_ == 0) {
              local_50 = local_50 + 1;
            }
            else {
              mpt_log((mpt_logger *)p._24_8_,"mpt_config_args",0x14,"%s: %s","element assiged",val);
            }
          }
        }
      }
      else {
        val = (mpt_value *)mpt_data_tostring(&end,((mpt_value *)ptr)->_type,(size_t *)0x0);
        if (val != (mpt_value *)0x0) goto LAB_0010db4e;
        if (p._24_8_ != 0) {
          local_50 = local_50 + 1;
          in_stack_ffffffffffffff38 = *(undefined8 *)((long)ptr + 8);
          mpt_log((mpt_logger *)p._24_8_,"mpt_config_args",4,"%s: %d (%d)","bad string value",
                  (ulong)local_50,in_stack_ffffffffffffff38);
        }
      }
LAB_0010dd3e:
      iVar2 = (*args->_vptr->advance)(args);
    } while (0 < iVar2);
    if (iVar2 == 0) {
      local_b4 = 0;
    }
    else {
      local_b4 = local_50;
    }
    cfg_local._4_4_ = local_b4;
  }
  return cfg_local._4_4_;
}

Assistant:

extern int mpt_config_args(MPT_INTERFACE(config) *cfg, MPT_INTERFACE(iterator) *args, MPT_INTERFACE(logger) *info)
{
	MPT_STRUCT(path) p = MPT_PATH_INIT;
	
	int res, count, err;
	
	if (!args) {
		res = cfg->_vptr->assign(cfg, &p, 0);
		if (res < 0) {
			if (info) {
				mpt_log(info, __func__, MPT_LOG(Error), "%s",
				        MPT_tr("unable to set default config"));
			}
			return res;
		}
		return 0;
	}
	err = 0;
	count = 0;
	do {
		MPT_STRUCT(property) pr = MPT_PROPERTY_INIT;
		const MPT_STRUCT(value) *val = args->_vptr->value(args);
		const void *ptr;
		const char *end;
		
		if (!val || !(ptr = val->_addr)) {
			if (info) {
				mpt_log(info, __func__, MPT_LOG(Error), "%s",
				        MPT_tr("unable to set default config"));
			}
			continue;
		}
		if (MPT_type_isConvertable(val->_type)) {
			MPT_INTERFACE(convertable) *conv;
			
			if (!(conv = *((void * const *) ptr))) {
				if (info) {
					mpt_log(info, __func__, MPT_LOG(Error), "%s",
					        MPT_tr("missing convertable pointer"));
				}
				continue;
			}
			/* get assign target */
			else if ((res = conv->_vptr->convert(conv, MPT_ENUM(TypeProperty), &pr)) >= 0 && pr.val._type) {
				p.assign = 0;
				mpt_path_set(&p, pr.name, -1);
			}
			else if ((res = conv->_vptr->convert(conv, 's', &pr.name)) < 0) {
				if (info) {
					mpt_log(info, __func__, MPT_LOG(Error), "%s",
					        MPT_tr("invalid assinment"));
				}
				continue;
			}
			else if (!pr.name) {
				if (info) {
					mpt_log(info, __func__, MPT_LOG(Error), "%s",
					        MPT_tr("invalid property name"));
				}
				continue;
			}
		}
		else if (!(pr.name = mpt_data_tostring(&ptr, val->_type, 0))) {
			if (info) {
				mpt_log(info, __func__, MPT_LOG(Warning), "%s: %d (%d)",
				        MPT_tr("bad string value"), ++count, val->_type);
			}
			continue;
		}
		/* no property type assigned */
		if (!pr.val._type) {
			if (!(end = strchr(pr.name, '='))) {
				++err;
				if (info) {
					mpt_log(info, __func__, MPT_LOG(Warning), "%s: %s",
					        MPT_tr("missing path separator"), pr.name);
				}
				continue;
			}
			p.assign = '=';
			mpt_path_set(&p, pr.name, end - pr.name);
			MPT_property_set_string(&pr, end + 1);
		}
		/* no top level assign */
		if (!pr.name) {
			++err;
			if (info) {
				mpt_log(info, __func__, MPT_LOG(Warning), "%s: %d",
				        MPT_tr("missing config path"), ++count);
			}
			return count ? count : MPT_ERROR(BadType);
		}
		/* assign config */
		if (cfg->_vptr->assign(cfg, &p, &pr.val) < 0) {
			++err;
			if (info) {
				mpt_log(info, __func__, MPT_LOG(Error), "%s (%d): %d",
				        MPT_tr("config assign error"), val->_type, ++count);
				continue;
			}
			return count ? count : MPT_ERROR(BadValue);
		}
		if (info) {
			mpt_log(info, __func__, MPT_LOG(Debug2), "%s: %s",
			        MPT_tr("element assiged"), pr.name);
			continue;
		}
		++count;
	} while ((res = args->_vptr->advance(args)) > 0);
	
	return res ? count : 0;
}